

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

bool ImGui::TableNextColumn(void)

{
  ImGuiTable *table_00;
  int column_n;
  ImGuiTable *table;
  ImGuiContext *g;
  
  table_00 = GImGui->CurrentTable;
  if (table_00 == (ImGuiTable *)0x0) {
    g._7_1_ = false;
  }
  else {
    if (((table_00->IsInsideRow & 1U) == 0) ||
       (table_00->ColumnsCount <= table_00->CurrentColumn + 1)) {
      TableNextRow(0,0.0);
      TableBeginCell(table_00,0);
    }
    else {
      if (table_00->CurrentColumn != -1) {
        TableEndCell(table_00);
      }
      TableBeginCell(table_00,table_00->CurrentColumn + 1);
    }
    g._7_1_ = (table_00->RequestOutputMaskByIndex & 1L << ((byte)table_00->CurrentColumn & 0x3f)) !=
              0;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::TableNextColumn()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;

    if (table->IsInsideRow && table->CurrentColumn + 1 < table->ColumnsCount)
    {
        if (table->CurrentColumn != -1)
            TableEndCell(table);
        TableBeginCell(table, table->CurrentColumn + 1);
    }
    else
    {
        TableNextRow();
        TableBeginCell(table, 0);
    }

    // Return whether the column is visible. User may choose to skip submitting items based on this return value,
    // however they shouldn't skip submitting for columns that may have the tallest contribution to row height.
    int column_n = table->CurrentColumn;
    return (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)) != 0;
}